

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O3

void Convert8To16Row_SSE2(uint8_t *src_y,uint16_t *dst_y,int scale,int width)

{
  bool bVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  auVar13._0_4_ = CONCAT22((short)scale,(short)scale);
  auVar13._4_4_ = auVar13._0_4_;
  auVar13._8_4_ = auVar13._0_4_;
  auVar13._12_4_ = auVar13._0_4_;
  do {
    auVar10 = *(undefined1 (*) [16])src_y;
    auVar9._0_14_ = auVar10._0_14_;
    auVar9[0xe] = auVar10[7];
    auVar9[0xf] = auVar10[7];
    auVar8._14_2_ = auVar9._14_2_;
    auVar8._0_13_ = auVar10._0_13_;
    auVar8[0xd] = auVar10[6];
    auVar7._13_3_ = auVar8._13_3_;
    auVar7._0_12_ = auVar10._0_12_;
    auVar7[0xc] = auVar10[6];
    auVar6._12_4_ = auVar7._12_4_;
    auVar6._0_11_ = auVar10._0_11_;
    auVar6[0xb] = auVar10[5];
    auVar5._11_5_ = auVar6._11_5_;
    auVar5._0_10_ = auVar10._0_10_;
    auVar5[10] = auVar10[5];
    auVar4._10_6_ = auVar5._10_6_;
    auVar4._0_9_ = auVar10._0_9_;
    auVar4[9] = auVar10[4];
    auVar3._9_7_ = auVar4._9_7_;
    auVar3._0_8_ = auVar10._0_8_;
    auVar3[8] = auVar10[4];
    auVar12._8_8_ = auVar3._8_8_;
    auVar12[7] = auVar10[3];
    auVar12[6] = auVar10[3];
    auVar12[5] = auVar10[2];
    auVar12[4] = auVar10[2];
    auVar12[3] = auVar10[1];
    auVar12[2] = auVar10[1];
    auVar12[0] = auVar10[0];
    auVar12[1] = auVar12[0];
    auVar11[1] = auVar10[8];
    auVar11[0] = auVar10[8];
    auVar11[2] = auVar10[9];
    auVar11[3] = auVar10[9];
    auVar11[4] = auVar10[10];
    auVar11[5] = auVar10[10];
    auVar11[6] = auVar10[0xb];
    auVar11[7] = auVar10[0xb];
    auVar11[8] = auVar10[0xc];
    auVar11[9] = auVar10[0xc];
    auVar11[10] = auVar10[0xd];
    auVar11[0xb] = auVar10[0xd];
    auVar11[0xc] = auVar10[0xe];
    auVar11[0xd] = auVar10[0xe];
    auVar11[0xf] = auVar10[0xf];
    auVar11[0xe] = auVar11[0xf];
    src_y = (uint8_t *)((long)src_y + 0x10);
    auVar10 = pmulhuw(auVar12,auVar13);
    auVar12 = pmulhuw(auVar11,auVar13);
    *(undefined1 (*) [16])dst_y = auVar10;
    *(undefined1 (*) [16])((long)dst_y + 0x10) = auVar12;
    dst_y = (uint16_t *)((long)dst_y + 0x20);
    iVar2 = width + -0x10;
    bVar1 = 0xf < width;
    width = iVar2;
  } while (iVar2 != 0 && bVar1);
  return;
}

Assistant:

void Convert8To16Row_SSE2(const uint8_t* src_y,
                          uint16_t* dst_y,
                          int scale,
                          int width) {
  // clang-format off
  asm volatile (
      "movd        %3,%%xmm2                     \n"
      "punpcklwd   %%xmm2,%%xmm2                 \n"
      "pshufd      $0x0,%%xmm2,%%xmm2            \n"

    // 32 pixels per loop.
    LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqa      %%xmm0,%%xmm1                 \n"
      "punpcklbw   %%xmm0,%%xmm0                 \n"
      "punpckhbw   %%xmm1,%%xmm1                 \n"
      "add         $0x10,%0                      \n"
      "pmulhuw     %%xmm2,%%xmm0                 \n"
      "pmulhuw     %%xmm2,%%xmm1                 \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "movdqu      %%xmm1,0x10(%1)               \n"
      "add         $0x20,%1                      \n"
      "sub         $0x10,%2                      \n"
      "jg          1b                            \n"
  : "+r"(src_y),   // %0
    "+r"(dst_y),   // %1
    "+r"(width)    // %2
  : "r"(scale)     // %3
  : "memory", "cc", "xmm0", "xmm1", "xmm2");
  // clang-format on
}